

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

void __thiscall hmi::renderer::renderer(renderer *this,SDL_Window *window)

{
  undefined1 auVar1 [16];
  int iVar2;
  GLuint GVar3;
  void *pvVar4;
  ostream *poVar5;
  char *pcVar6;
  vec2i vVar7;
  vec<float,_2UL> vVar8;
  renderer *this_00;
  undefined4 uVar9;
  undefined4 uVar10;
  unique_ptr<char[],_std::default_delete<char[]>_> info_log;
  GLint info_log_length;
  GLint link_status;
  
  this->m_window = window;
  this->m_context = (void *)0x0;
  this->m_program = 0;
  pvVar4 = (void *)SDL_GL_CreateContext(window);
  this->m_context = pvVar4;
  if (pvVar4 == (void *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to create a context: ");
    pcVar6 = (char *)SDL_GetError();
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    return;
  }
  iVar2 = SDL_GL_MakeCurrent(this->m_window,pvVar4);
  if (iVar2 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to make the context current: ");
    pcVar6 = (char *)SDL_GetError();
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  iVar2 = gladLoadGLES2Loader(SDL_GL_GetProcAddress);
  if (iVar2 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Failed to load GLES2");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendEquationSeparate)(0x8006,0x8006);
  (*glad_glBlendFuncSeparate)(0x302,0x303,1,0x303);
  vVar7 = get_size(this);
  vVar8.field_0.data[1] = (float)vVar7.field_0._4_4_;
  vVar8.field_0.data[0] = (float)vVar7.field_0._0_4_;
  *(anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 *)(this->m_view_size).field_0.x.data =
       (vec_accessor<float,_2UL,_0UL>)vVar8.field_0;
  uVar9 = 0x40000000;
  uVar10 = 0;
  vVar8 = operator/(vVar8,2.0);
  *(anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 *)(this->m_view_center).field_0.x.data =
       (vec_accessor<float,_2UL,_0UL>)vVar8.field_0;
  GVar3 = (*glad_glCreateProgram)();
  this->m_program = GVar3;
  GVar3 = anon_unknown_0::compile_shader
                    ("\n      #version 100\n\n      attribute vec2 a_position;\n      attribute vec4 a_color;\n\n      varying vec4 v_color;\n\n      uniform mat3 u_transform;\n\n      void main(void) {\n        v_color = a_color;\n\n        vec3 worldPosition = vec3(a_position, 1);\n        vec3 normalizedPosition = worldPosition * u_transform;\n\n        gl_Position = vec4(normalizedPosition.xy, 0, 1);\n      }\n    "
                     ,0x8b31);
  (*glad_glAttachShader)(this->m_program,GVar3);
  (*glad_glDeleteShader)(GVar3);
  GVar3 = anon_unknown_0::compile_shader
                    ("\n      #version 100\n\n      precision mediump float;\n\n      varying vec4 v_color;\n\n      void main(void) {\n        gl_FragColor = v_color;\n      }\n    "
                     ,0x8b30);
  (*glad_glAttachShader)(this->m_program,GVar3);
  (*glad_glDeleteShader)(GVar3);
  (*glad_glLinkProgram)(this->m_program);
  link_status = 0;
  this_00 = (renderer *)(ulong)this->m_program;
  (*glad_glGetProgramiv)(this->m_program,0x8b82,&link_status);
  if (link_status == 0) {
    (*glad_glGetProgramiv)(this->m_program,0x8b84,&info_log_length);
    if ((long)info_log_length < 1) {
      __assert_fail("info_log_length > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/renderer.cc"
                    ,0x90,"hmi::renderer::renderer(SDL_Window *)");
    }
    info_log._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         operator_new__((long)info_log_length);
    (*glad_glGetProgramInfoLog)
              (this->m_program,info_log_length,(GLsizei *)0x0,
               (GLchar *)
               info_log._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl);
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error while linking the program: ");
    poVar5 = std::operator<<(poVar5,(char *)info_log._M_t.
                                            super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                            .super__Head_base<0UL,_char_*,_false>._M_head_impl);
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = (renderer *)&info_log;
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_00);
  }
  auVar1._4_4_ = uVar10;
  auVar1._0_4_ = uVar9;
  auVar1._8_8_ = 0;
  clear(this_00,(color4f)(auVar1 << 0x40));
  return;
}

Assistant:

renderer::renderer(SDL_Window *window)
  : m_window(window)
  , m_context(nullptr)
  , m_program(0)
  {
    // create context

    m_context = SDL_GL_CreateContext(window);

    if (m_context == nullptr) {
      std::cerr << "Failed to create a context: " << SDL_GetError() << std::endl;
      return;
    }

    int err = SDL_GL_MakeCurrent(m_window, m_context);

    if (err != 0) {
      std::cerr << "Failed to make the context current: " << SDL_GetError() << std::endl;
    }

    // load GLES2 functions

    if (gladLoadGLES2Loader(SDL_GL_GetProcAddress) == 0) {
      std::cerr << "Failed to load GLES2" << std::endl;
    }

    glEnable(GL_BLEND);
    glBlendEquationSeparate(GL_FUNC_ADD, GL_FUNC_ADD);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA);

    // create view

    m_view_size = get_size();
    m_view_center = m_view_size / 2.0f;

    // create shader

    m_program = glCreateProgram();

    GLuint vertex_shader_id = compile_shader(g_vertex_shader, GL_VERTEX_SHADER);
    glAttachShader(m_program, vertex_shader_id);
    glDeleteShader(vertex_shader_id); // the shader is still here because it is attached to the program

    GLuint fragment_shader_id = compile_shader(g_fragment_shader, GL_FRAGMENT_SHADER);
    glAttachShader(m_program, fragment_shader_id);
    glDeleteShader(fragment_shader_id); // the shader is still here because it is attached to the program

    glLinkProgram(m_program);

    GLint link_status = GL_FALSE;
    glGetProgramiv(m_program, GL_LINK_STATUS, &link_status);

    if (link_status == GL_FALSE) {
      GLint info_log_length;
      glGetProgramiv(m_program, GL_INFO_LOG_LENGTH, &info_log_length);

      assert(info_log_length > 0);
      std::unique_ptr<char[]> info_log(new char[info_log_length]);
      glGetProgramInfoLog(m_program, info_log_length, nullptr, info_log.get());

      std::cerr << "Error while linking the program: " << info_log.get() << std::endl;
    }

    // initialize the screen

    clear(color::black);
  }